

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O2

void testing::internal::PrintTo(wchar_t *s,ostream *os)

{
  ostream *poVar1;
  size_t len;
  
  if (s != (wchar_t *)0x0) {
    poVar1 = std::ostream::_M_insert<void_const*>(os);
    std::operator<<(poVar1," pointing to ");
    len = wcslen(s);
    PrintCharsAsStringTo<wchar_t>(s,len,os);
    return;
  }
  std::operator<<(os,"NULL");
  return;
}

Assistant:

void PrintTo(const wchar_t* s, ostream* os) { PrintCStringTo(s, os); }